

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

char * apprun_env_replace_startup_by_original_section
                 (apprun_env_item_t *item,char *startup_value_section)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  char *__dest;
  char *new_value;
  uint new_value_len;
  char *startup_value_section_local;
  apprun_env_item_t *item_local;
  
  sVar1 = strlen(item->original_value);
  sVar2 = strlen(item->current_value);
  sVar3 = strlen(item->startup_value);
  __dest = (char *)calloc((ulong)((((int)sVar1 + (int)sVar2) - (int)sVar3) + 1),1);
  strncpy(__dest,item->current_value,(long)startup_value_section - (long)item->current_value);
  strcat(__dest,item->original_value);
  sVar1 = strlen(item->startup_value);
  strcat(__dest,startup_value_section + sVar1);
  return __dest;
}

Assistant:

char *apprun_env_replace_startup_by_original_section(const apprun_env_item_t *item,
                                                     const char *startup_value_section) {
    // replace startup_value by original_value
    unsigned new_value_len = strlen(item->original_value) +
                             strlen(item->current_value) - strlen(item->startup_value) + 1;
    char *new_value = calloc(new_value_len, sizeof(char));

    // copy prefixed values
    strncpy(new_value, item->current_value, startup_value_section - item->current_value);

    // add original value
    strcat(new_value, item->original_value);

    // add postfix
    strcat(new_value, startup_value_section + strlen(item->startup_value));
    return new_value;
}